

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

pool_ptr<soul::AST::Namespace> __thiscall
soul::StructuralParser::parseNamespaceDecl
          (StructuralParser *this,CodeLocation *keywordLocation,ModuleBase *ns)

{
  ModuleBase *ns_local;
  CodeLocation *keywordLocation_local;
  StructuralParser *this_local;
  
  ns_local = ns;
  keywordLocation_local = keywordLocation;
  this_local = this;
  CodeLocation::CodeLocation((CodeLocation *)&stack0xffffffffffffffc8,(CodeLocation *)ns);
  parseTopLevelItem<soul::AST::Namespace>
            (this,keywordLocation,(ModuleBase *)&stack0xffffffffffffffc8);
  CodeLocation::~CodeLocation((CodeLocation *)&stack0xffffffffffffffc8);
  return (pool_ptr<soul::AST::Namespace>)(Namespace *)this;
}

Assistant:

pool_ptr<AST::Namespace> parseNamespaceDecl (CodeLocation keywordLocation, AST::ModuleBase& ns)   { return parseTopLevelItem<AST::Namespace> (keywordLocation, ns); }